

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast-check.cpp
# Opt level: O1

void __thiscall
wasm::CastCheckTest_CastToBottom_Test::~CastCheckTest_CastToBottom_Test
          (CastCheckTest_CastToBottom_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F(CastCheckTest, CastToBottom) {
#define EXPECT_CAST(srcNullability, srcExactness, castNullability, result)     \
  EXPECT_EQ(evaluateCastCheck(Type(super, srcNullability, srcExactness),       \
                              Type(HeapType::none, castNullability, Inexact)), \
            result);

  EXPECT_CAST(Nullable, Inexact, Nullable, SuccessOnlyIfNull);
  EXPECT_CAST(Nullable, Inexact, NonNullable, Failure);
  EXPECT_CAST(Nullable, Exact, Nullable, SuccessOnlyIfNull);
  EXPECT_CAST(Nullable, Exact, NonNullable, Failure);
  EXPECT_CAST(NonNullable, Inexact, Nullable, Failure);
  EXPECT_CAST(NonNullable, Inexact, NonNullable, Failure);
  EXPECT_CAST(NonNullable, Exact, Nullable, Failure);
  EXPECT_CAST(NonNullable, Exact, NonNullable, Failure);
#undef EXPECT_CAST
}